

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CInstIterNext(CInstIter *pIter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  int iEnd;
  int rc;
  int io;
  int ic;
  int ip;
  int local_24;
  int local_14;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  *(undefined4 *)((long)in_RDI + 0x1c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
  do {
    do {
      bVar1 = false;
      if (local_24 == 0) {
        bVar1 = *(int *)((long)in_RDI + 0x14) < (int)in_RDI[3];
      }
      if (!bVar1) goto LAB_0028eb09;
      local_c = 0xaaaaaaaa;
      local_10 = -0x55555556;
      local_14 = -0x55555556;
      local_24 = (**(code **)(*in_RDI + 0x48))
                           (in_RDI[1],*(undefined4 *)((long)in_RDI + 0x14),&local_c,&local_10,
                            &local_14);
    } while (local_24 != 0);
    if (local_10 == (int)in_RDI[2]) {
      iVar2 = local_14 + -1;
      iVar3 = (**(code **)(*in_RDI + 0x38))(in_RDI[1],local_c);
      iVar2 = iVar2 + iVar3;
      if (*(int *)((long)in_RDI + 0x1c) < 0) {
        *(int *)((long)in_RDI + 0x1c) = local_14;
        *(int *)(in_RDI + 4) = iVar2;
      }
      else {
        if ((int)in_RDI[4] < local_14) {
LAB_0028eb09:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
            __stack_chk_fail();
          }
          return local_24;
        }
        if ((int)in_RDI[4] < iVar2) {
          *(int *)(in_RDI + 4) = iVar2;
        }
      }
    }
    *(int *)((long)in_RDI + 0x14) = *(int *)((long)in_RDI + 0x14) + 1;
  } while( true );
}

Assistant:

static int fts5CInstIterNext(CInstIter *pIter){
  int rc = SQLITE_OK;
  pIter->iStart = -1;
  pIter->iEnd = -1;

  while( rc==SQLITE_OK && pIter->iInst<pIter->nInst ){
    int ip; int ic; int io;
    rc = pIter->pApi->xInst(pIter->pFts, pIter->iInst, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      if( ic==pIter->iCol ){
        int iEnd = io - 1 + pIter->pApi->xPhraseSize(pIter->pFts, ip);
        if( pIter->iStart<0 ){
          pIter->iStart = io;
          pIter->iEnd = iEnd;
        }else if( io<=pIter->iEnd ){
          if( iEnd>pIter->iEnd ) pIter->iEnd = iEnd;
        }else{
          break;
        }
      }
      pIter->iInst++;
    }
  }

  return rc;
}